

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall Parser::Parser(Parser *this,TokenBuffer *input)

{
  RefCount<ParserInputState> *in_RSI;
  undefined8 *in_RDI;
  TokenBuffer *in_stack_ffffffffffffffb8;
  ParserInputState *in_stack_ffffffffffffffc0;
  ParserInputState *in_stack_ffffffffffffffe8;
  
  *in_RDI = &PTR__Parser_0036cb10;
  operator_new(0x38);
  ParserInputState::ParserInputState(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  RefCount<ParserInputState>::RefCount(in_RSI,in_stack_ffffffffffffffe8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x2942bd);
  RefCount<AST>::RefCount((RefCount<AST> *)in_RSI,(AST *)in_stack_ffffffffffffffe8);
  ASTFactory::ASTFactory((ASTFactory *)(in_RDI + 6));
  return;
}

Assistant:

Parser::Parser(TokenBuffer* input)
: inputState(new ParserInputState(input))
{
}